

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImDrawList::AddRectFilled
          (ImDrawList *this,ImVec2 *a,ImVec2 *b,ImU32 col,float rounding,int rounding_corners_flags)

{
  ImVec2 *__src;
  ImVec2 *__dest;
  
  if (0xffffff < col) {
    if (rounding <= 0.0) {
      PrimReserve(this,6,4);
      PrimRect(this,a,b,col);
      return;
    }
    PathRect(this,a,b,rounding,rounding_corners_flags);
    AddConvexPolyFilled(this,(this->_Path).Data,(this->_Path).Size,col);
    if ((this->_Path).Capacity < 0) {
      __dest = (ImVec2 *)ImGui::MemAlloc(0);
      __src = (this->_Path).Data;
      if (__src != (ImVec2 *)0x0) {
        memcpy(__dest,__src,(long)(this->_Path).Size << 3);
        ImGui::MemFree((this->_Path).Data);
      }
      (this->_Path).Data = __dest;
      (this->_Path).Capacity = 0;
    }
    (this->_Path).Size = 0;
  }
  return;
}

Assistant:

void ImDrawList::AddRectFilled(const ImVec2& a, const ImVec2& b, ImU32 col, float rounding, int rounding_corners_flags)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;
    if (rounding > 0.0f)
    {
        PathRect(a, b, rounding, rounding_corners_flags);
        PathFillConvex(col);
    }
    else
    {
        PrimReserve(6, 4);
        PrimRect(a, b, col);
    }
}